

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

void __thiscall
cubeb_resampler_drift_drop_data_Test::TestBody(cubeb_resampler_drift_drop_data_Test *this)

{
  uint uVar1;
  cubeb_resampler *resampler;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  long expected_start;
  uint32_t input_channels;
  uint32_t stride;
  long lVar5;
  bool bVar6;
  AssertionResult gtest_ar;
  long local_108;
  long frames;
  long got;
  cubeb_resampler *local_f0;
  AssertHelper local_e8;
  closure c;
  vector<float,_std::allocator<float>_> output_buffer;
  long BUF_BASE_SIZE;
  long prebuffer_frames;
  vector<float,_std::allocator<float>_> input_buffer_normal;
  vector<float,_std::allocator<float>_> input_buffer_prebuffer;
  cubeb_stream_params input_params;
  vector<float,_std::allocator<float>_> input_buffer_glitch;
  cubeb_stream_params output_params;
  AssertHelper local_38;
  
  lVar5 = 1;
  do {
    if (lVar5 == 3) {
      return;
    }
    stride = (uint32_t)lVar5;
    input_params.format = CUBEB_SAMPLE_FLOAT32LE;
    input_params.rate = 0xac44;
    output_params.channels = 2;
    output_params.format = CUBEB_SAMPLE_FLOAT32LE;
    output_params.rate = 0xac44;
    c.input_channel_count = stride;
    input_params.channels = stride;
    resampler = cubeb_resampler_create
                          ((cubeb_stream *)0x0,&input_params,&output_params,0xac44,
                           cb_passthrough_resampler_duplex,&c,CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);
    BUF_BASE_SIZE = 0x100;
    std::vector<float,_std::allocator<float>_>::vector
              (&input_buffer_prebuffer,lVar5 << 9,(allocator_type *)&input_buffer_glitch);
    std::vector<float,_std::allocator<float>_>::vector
              (&input_buffer_glitch,lVar5 * 0xa00,(allocator_type *)&input_buffer_normal);
    std::vector<float,_std::allocator<float>_>::vector
              (&input_buffer_normal,lVar5 << 8,(allocator_type *)&output_buffer);
    std::vector<float,_std::allocator<float>_>::vector
              (&output_buffer,0x200,(allocator_type *)&gtest_ar);
    prebuffer_frames =
         (ulong)((long)input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2) / (ulong)input_params.channels
    ;
    local_108 = seq<float>(input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start,stride,0,prebuffer_frames);
    local_f0 = resampler;
    got = cubeb_resampler_fill
                    (resampler,
                     input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start,&prebuffer_frames,
                     output_buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,0x100);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&gtest_ar,"prebuffer_frames","BUF_BASE_SIZE",&prebuffer_frames,
               &BUF_BASE_SIZE);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&frames);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar4 = 0x359;
LAB_00109dd0:
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,iVar4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_e8,(Message *)&frames);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&frames);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      bVar6 = false;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)&gtest_ar,"got","BUF_BASE_SIZE",&got,&BUF_BASE_SIZE);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&frames);
        pcVar3 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar4 = 0x35a;
        goto LAB_00109dd0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      expected_start = 0x100;
      iVar4 = 300;
      uVar2 = 0;
      while( true ) {
        uVar1 = (uVar2 & 0xffff) % 100;
        bVar6 = iVar4 == 0;
        iVar4 = iVar4 + -1;
        if (bVar6) break;
        frames = 0x100;
        if ((short)uVar1 == 2) {
          local_108 = seq<float>(input_buffer_normal.
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start,stride,local_108,0x100);
          gtest_ar.success_ = false;
          gtest_ar._1_7_ = 1;
          got = cubeb_resampler_fill
                          (local_f0,input_buffer_normal.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start,(long *)&gtest_ar,
                           output_buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start,0x100);
          is_not_seq<float>(output_buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,2,0x100,expected_start);
          expected_start =
               (long)(output_buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[0x1ff] + 1.0);
        }
        else if (uVar1 == 1) {
          local_108 = seq<float>(input_buffer_glitch.
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start,stride,local_108,0xa00);
          frames = 0xa00;
          got = cubeb_resampler_fill
                          (local_f0,input_buffer_glitch.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start,&frames,
                           output_buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start,0x100);
          is_seq<float>(output_buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,2,0x100,expected_start);
          expected_start = expected_start + 0x100;
        }
        else {
          local_108 = seq<float>(input_buffer_normal.
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start,stride,local_108,0x100);
          gtest_ar.success_ = false;
          gtest_ar._1_7_ = 1;
          got = cubeb_resampler_fill
                          (local_f0,input_buffer_normal.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start,(long *)&gtest_ar,
                           output_buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start,0x100);
          is_seq<float>(output_buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,2,0x100,expected_start);
          expected_start = expected_start + 0x100;
        }
        testing::internal::CmpHelperEQ<long,long>
                  ((internal *)&gtest_ar,"got","BUF_BASE_SIZE",&got,&BUF_BASE_SIZE);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_e8);
          pcVar3 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                     ,0x37a,pcVar3);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_e8);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_e8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          bVar6 = false;
          goto LAB_00109e87;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        uVar2 = uVar2 + 1;
      }
      cubeb_resampler_destroy(local_f0);
      bVar6 = true;
    }
LAB_00109e87:
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&output_buffer.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&input_buffer_normal.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&input_buffer_glitch.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>);
    lVar5 = lVar5 + 1;
    if (!bVar6) {
      return;
    }
  } while( true );
}

Assistant:

TEST(cubeb, resampler_drift_drop_data)
{
  for (uint32_t input_channels = 1; input_channels < 3; input_channels++) {
    cubeb_stream_params input_params;
    cubeb_stream_params output_params;

    const int output_channels = 2;
    const int sample_rate = 44100;

    input_params.channels = input_channels;
    input_params.rate = sample_rate;
    input_params.format = CUBEB_SAMPLE_FLOAT32NE;

    output_params.channels = output_channels;
    output_params.rate = sample_rate;
    output_params.format = CUBEB_SAMPLE_FLOAT32NE;

    int target_rate = input_params.rate;

    closure c;
    c.input_channel_count = input_channels;

    cubeb_resampler * resampler =
      cubeb_resampler_create((cubeb_stream*)nullptr, &input_params, &output_params,
        target_rate, cb_passthrough_resampler_duplex, &c,
        CUBEB_RESAMPLER_QUALITY_VOIP, CUBEB_RESAMPLER_RECLOCK_NONE);

    const long BUF_BASE_SIZE = 256;

    // The factor by which the deadline is missed. This is intentionally
    // kind of large to trigger the frame drop quickly. In real life, multiple
    // smaller under-runs would accumulate.
    const long UNDERRUN_FACTOR = 10;
    // Number buffer used for pre-buffering, that some backends do.
    const long PREBUFFER_FACTOR = 2;

    std::vector<float> input_buffer_prebuffer(input_channels * BUF_BASE_SIZE * PREBUFFER_FACTOR);
    std::vector<float> input_buffer_glitch(input_channels * BUF_BASE_SIZE * UNDERRUN_FACTOR);
    std::vector<float> input_buffer_normal(input_channels * BUF_BASE_SIZE);
    std::vector<float> output_buffer(output_channels * BUF_BASE_SIZE);

    long seq_idx = 0;
    long output_seq_idx = 0;

    long prebuffer_frames = input_buffer_prebuffer.size() / input_params.channels;
    seq_idx = seq(input_buffer_prebuffer.data(), input_channels, seq_idx,
      prebuffer_frames);

    long got = cubeb_resampler_fill(resampler, input_buffer_prebuffer.data(), &prebuffer_frames,
      output_buffer.data(), BUF_BASE_SIZE);

    output_seq_idx += BUF_BASE_SIZE;

    // prebuffer_frames will hold the frames used by the resampler.
    ASSERT_EQ(prebuffer_frames, BUF_BASE_SIZE);
    ASSERT_EQ(got, BUF_BASE_SIZE);

    for (uint32_t i = 0; i < 300; i++) {
      long int frames = BUF_BASE_SIZE;
      if (i != 0 && (i % 100) == 1) {
        // Once in a while, the output thread misses its deadline.
        // The input thread still produces data, so it ends up accumulating. Simulate this by providing a
        // much bigger input buffer. Check that the sequence is now unaligned, meaning we've dropped data
        // to keep everything in sync.
        seq_idx = seq(input_buffer_glitch.data(), input_channels, seq_idx, BUF_BASE_SIZE * UNDERRUN_FACTOR);
        frames = BUF_BASE_SIZE * UNDERRUN_FACTOR;
        got = cubeb_resampler_fill(resampler, input_buffer_glitch.data(), &frames, output_buffer.data(), BUF_BASE_SIZE);
        is_seq(output_buffer.data(), 2, BUF_BASE_SIZE, output_seq_idx);
        output_seq_idx += BUF_BASE_SIZE;
      }
      else if (i != 0 && (i % 100) == 2) {
        // On the next iteration, the sequence should be broken
        seq_idx = seq(input_buffer_normal.data(), input_channels, seq_idx, BUF_BASE_SIZE);
        long normal_input_frame_count = 256;
        got = cubeb_resampler_fill(resampler, input_buffer_normal.data(), &normal_input_frame_count, output_buffer.data(), BUF_BASE_SIZE);
        is_not_seq(output_buffer.data(), output_channels, BUF_BASE_SIZE, output_seq_idx);
        // Reclock so that we can use is_seq again.
        output_seq_idx = output_buffer[BUF_BASE_SIZE * output_channels - 1] + 1;
      }
      else {
        // normal case
        seq_idx = seq(input_buffer_normal.data(), input_channels, seq_idx, BUF_BASE_SIZE);
        long normal_input_frame_count = 256;
        got = cubeb_resampler_fill(resampler, input_buffer_normal.data(), &normal_input_frame_count, output_buffer.data(), BUF_BASE_SIZE);
        is_seq(output_buffer.data(), output_channels, BUF_BASE_SIZE, output_seq_idx);
        output_seq_idx += BUF_BASE_SIZE;
      }
      ASSERT_EQ(got, BUF_BASE_SIZE);
    }

    cubeb_resampler_destroy(resampler);
  }
}